

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O1

timeval * event_base_init_common_timeout(event_base *base,timeval *duration)

{
  short *psVar1;
  __time_t *p_Var2;
  int iVar3;
  uint uVar4;
  common_timeout_list **ppcVar5;
  common_timeout_list *pcVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  __suseconds_t *p_Var10;
  timeval *ptVar11;
  ulong local_40;
  long local_38;
  
  p_Var10 = &duration->tv_usec;
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,base->th_base_lock);
  }
  uVar9 = *p_Var10;
  if (1000000 < (long)uVar9) {
    p_Var2 = &duration->tv_sec;
    local_40 = uVar9;
    if ((((uint)uVar9 & 0xf0000000) == 0x50000000) &&
       ((int)((uint)(uVar9 >> 0x14) & 0xff) < base->n_common_timeouts)) {
      local_40 = (ulong)((uint)uVar9 & 0xfffff);
    }
    p_Var10 = (__suseconds_t *)&local_40;
    duration = (timeval *)&local_38;
    local_38 = *p_Var2 + (long)local_40 / 1000000;
    local_40 = (long)local_40 % 1000000;
  }
  iVar3 = base->n_common_timeouts;
  if ((long)iVar3 < 1) {
    ptVar11 = (timeval *)0x0;
  }
  else {
    lVar7 = 0;
    ptVar11 = (timeval *)0x0;
    do {
      pcVar6 = base->common_timeout_queues[lVar7];
      if (duration->tv_sec == (pcVar6->duration).tv_sec) {
        iVar8 = 0;
        if (*p_Var10 == (ulong)((uint)(pcVar6->duration).tv_usec & 0xfffff)) {
          uVar4 = (uint)(pcVar6->duration).tv_usec;
          if (((uVar4 & 0xf0000000) != 0x50000000) || (iVar3 <= (int)(uVar4 >> 0x14 & 0xff))) {
            event_base_init_common_timeout_cold_2();
            goto LAB_002d71d2;
          }
          ptVar11 = &pcVar6->duration;
          iVar8 = 0xb;
        }
      }
      else {
        iVar8 = 0;
      }
      if (iVar8 != 0) {
        if (iVar8 != 0xb) {
          return ptVar11;
        }
        goto LAB_002d717f;
      }
      lVar7 = lVar7 + 1;
    } while (iVar3 != lVar7);
  }
  if (iVar3 == 0x100) {
    event_warnx("%s: Too many common timeouts already in use; we only support %d per event_base",
                "event_base_init_common_timeout",0x100);
  }
  else {
    if (base->n_common_timeouts_allocated == iVar3) {
      uVar9 = 0x10;
      if (0xf < iVar3) {
        uVar9 = (ulong)(uint)(iVar3 * 2);
      }
      if (mm_realloc_fn_ == (_func_void_ptr_void_ptr_size_t *)0x0) {
        ppcVar5 = (common_timeout_list **)realloc(base->common_timeout_queues,uVar9 * 8);
      }
      else {
        ppcVar5 = (common_timeout_list **)(*mm_realloc_fn_)(base->common_timeout_queues,uVar9 * 8);
      }
      if (ppcVar5 == (common_timeout_list **)0x0) {
        event_warn("%s: realloc","event_base_init_common_timeout");
        iVar3 = 0xb;
      }
      else {
        base->n_common_timeouts_allocated = (int)uVar9;
        base->common_timeout_queues = ppcVar5;
        iVar3 = 0;
      }
      if (iVar3 == 0xb) goto LAB_002d717f;
      if (iVar3 != 0) {
        return ptVar11;
      }
    }
    pcVar6 = (common_timeout_list *)event_mm_calloc_(1,0xa8);
    if (pcVar6 == (common_timeout_list *)0x0) {
      event_warn("%s: calloc","event_base_init_common_timeout");
    }
    else {
      (pcVar6->events).tqh_first = (event *)0x0;
      (pcVar6->events).tqh_last = (event **)pcVar6;
      (pcVar6->duration).tv_sec = duration->tv_sec;
      (pcVar6->duration).tv_usec = (long)(base->n_common_timeouts << 0x14) | *p_Var10 | 0x50000000;
      event_assign(&pcVar6->timeout_event,base,-1,0,common_timeout_callback,pcVar6);
      psVar1 = &(pcVar6->timeout_event).ev_evcallback.evcb_flags;
      *(byte *)psVar1 = (byte)*psVar1 | 0x10;
      event_debug_assert_is_setup_(&pcVar6->timeout_event);
      if ((((pcVar6->timeout_event).ev_evcallback.evcb_flags & 8) == 0) &&
         (0 < ((pcVar6->timeout_event).ev_base)->nactivequeues)) {
        (pcVar6->timeout_event).ev_evcallback.evcb_pri = '\0';
      }
      ptVar11 = &pcVar6->duration;
      pcVar6->base = base;
      iVar3 = base->n_common_timeouts;
      base->n_common_timeouts = iVar3 + 1;
      base->common_timeout_queues[iVar3] = pcVar6;
    }
  }
LAB_002d717f:
  if ((ptVar11 == (timeval *)0x0) ||
     ((uVar4 = (uint)ptVar11->tv_usec, (uVar4 & 0xf0000000) == 0x50000000 &&
      ((int)(uVar4 >> 0x14 & 0xff) < base->n_common_timeouts)))) {
    if (base->th_base_lock != (void *)0x0) {
      (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
    }
    return ptVar11;
  }
LAB_002d71d2:
  event_base_init_common_timeout_cold_1();
}

Assistant:

const struct timeval *
event_base_init_common_timeout(struct event_base *base,
    const struct timeval *duration)
{
	int i;
	struct timeval tv;
	const struct timeval *result=NULL;
	struct common_timeout_list *new_ctl;

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	if (duration->tv_usec > 1000000) {
		memcpy(&tv, duration, sizeof(struct timeval));
		if (is_common_timeout(duration, base))
			tv.tv_usec &= MICROSECONDS_MASK;
		tv.tv_sec += tv.tv_usec / 1000000;
		tv.tv_usec %= 1000000;
		duration = &tv;
	}
	for (i = 0; i < base->n_common_timeouts; ++i) {
		const struct common_timeout_list *ctl =
		    base->common_timeout_queues[i];
		if (duration->tv_sec == ctl->duration.tv_sec &&
		    duration->tv_usec ==
		    (ctl->duration.tv_usec & MICROSECONDS_MASK)) {
			EVUTIL_ASSERT(is_common_timeout(&ctl->duration, base));
			result = &ctl->duration;
			goto done;
		}
	}
	if (base->n_common_timeouts == MAX_COMMON_TIMEOUTS) {
		event_warnx("%s: Too many common timeouts already in use; "
		    "we only support %d per event_base", __func__,
		    MAX_COMMON_TIMEOUTS);
		goto done;
	}
	if (base->n_common_timeouts_allocated == base->n_common_timeouts) {
		int n = base->n_common_timeouts < 16 ? 16 :
		    base->n_common_timeouts*2;
		struct common_timeout_list **newqueues =
		    mm_realloc(base->common_timeout_queues,
			n*sizeof(struct common_timeout_queue *));
		if (!newqueues) {
			event_warn("%s: realloc",__func__);
			goto done;
		}
		base->n_common_timeouts_allocated = n;
		base->common_timeout_queues = newqueues;
	}
	new_ctl = mm_calloc(1, sizeof(struct common_timeout_list));
	if (!new_ctl) {
		event_warn("%s: calloc",__func__);
		goto done;
	}
	TAILQ_INIT(&new_ctl->events);
	new_ctl->duration.tv_sec = duration->tv_sec;
	new_ctl->duration.tv_usec =
	    duration->tv_usec | COMMON_TIMEOUT_MAGIC |
	    (base->n_common_timeouts << COMMON_TIMEOUT_IDX_SHIFT);
	evtimer_assign(&new_ctl->timeout_event, base,
	    common_timeout_callback, new_ctl);
	new_ctl->timeout_event.ev_flags |= EVLIST_INTERNAL;
	event_priority_set(&new_ctl->timeout_event, 0);
	new_ctl->base = base;
	base->common_timeout_queues[base->n_common_timeouts++] = new_ctl;
	result = &new_ctl->duration;

done:
	if (result)
		EVUTIL_ASSERT(is_common_timeout(result, base));

	EVBASE_RELEASE_LOCK(base, th_base_lock);
	return result;
}